

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base _Var3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  LogMessage *pLVar6;
  __hash_code __c;
  __node_ptr p_Var7;
  __node_ptr p_Var8;
  __node_base_ptr *pp_Var9;
  __node_base_ptr *pp_Var10;
  ulong uVar11;
  size_t __bkt_count;
  ulong uVar12;
  __node_base _Var13;
  undefined1 auVar14 [16];
  LogFinisher local_a9;
  Symbol symbol_local;
  _Alloc_hider local_90;
  __node_ptr local_88;
  pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> local_58;
  StringPiece local_40;
  
  symbol_local = symbol;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,name);
  Symbol::parent_name_key(&local_58,&symbol_local);
  bVar5 = stringpiece_internal::operator==(local_40,local_58.second);
  if (!bVar5) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x685);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_90,
                        "CHECK failed: (name) == (symbol.parent_name_key().second): ");
    internal::LogFinisher::operator=(&local_a9,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&local_90);
  }
  pLVar6 = (LogMessage *)&symbol_local;
  Symbol::parent_name_key(&local_58,(Symbol *)pLVar6);
  if (local_58.first != parent) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x686);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_90,
                        "CHECK failed: (parent) == (symbol.parent_name_key().first): ");
    internal::LogFinisher::operator=(&local_a9,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&local_90);
  }
  __c = std::__detail::
        _Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
        ::_M_hash_code((_Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                        *)&symbol_local,(Symbol *)pLVar6);
  uVar11 = __c % (this->symbols_by_parent_)._M_h._M_bucket_count;
  p_Var7 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_node((_Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)this,uVar11,(key_type *)&symbol_local,__c);
  if (p_Var7 == (__node_ptr)0x0) {
    p_Var8 = std::__detail::
             _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::Symbol,true>>>
             ::_M_allocate_node<google::protobuf::Symbol_const&>
                       ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::Symbol,true>>>
                         *)this,&symbol_local);
    local_90._M_p = (pointer)this;
    local_88 = p_Var8;
    auVar14 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_parent_)._M_h._M_rehash_policy,
                         (this->symbols_by_parent_)._M_h._M_bucket_count,
                         (this->symbols_by_parent_)._M_h._M_element_count);
    __bkt_count = auVar14._8_8_;
    if ((auVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var9 = (this->symbols_by_parent_)._M_h._M_buckets;
    }
    else {
      if (__bkt_count == 1) {
        pp_Var9 = &(this->symbols_by_parent_)._M_h._M_single_bucket;
        (this->symbols_by_parent_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        pp_Var9 = std::__detail::
                  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::Symbol,_true>_>_>
                  ::_M_allocate_buckets
                            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::Symbol,_true>_>_>
                              *)this,__bkt_count);
      }
      p_Var1 = &(this->symbols_by_parent_)._M_h._M_before_begin;
      _Var3._M_nxt = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar11 = 0;
LAB_00357219:
      _Var13._M_nxt = _Var3._M_nxt;
      uVar12 = uVar11;
      if (_Var13._M_nxt != (_Hash_node_base *)0x0) {
        _Var3._M_nxt = (_Var13._M_nxt)->_M_nxt;
        uVar11 = (ulong)_Var13._M_nxt[2]._M_nxt % __bkt_count;
        if (pp_Var9[uVar11] == (__node_base_ptr)0x0) goto LAB_0035724a;
        (_Var13._M_nxt)->_M_nxt = pp_Var9[uVar11]->_M_nxt;
        pp_Var10 = &pp_Var9[uVar11]->_M_nxt;
        uVar11 = uVar12;
        goto LAB_00357269;
      }
      std::
      _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_deallocate_buckets
                ((_Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)this);
      (this->symbols_by_parent_)._M_h._M_bucket_count = __bkt_count;
      (this->symbols_by_parent_)._M_h._M_buckets = pp_Var9;
      uVar11 = __c % __bkt_count;
    }
    (p_Var8->super__Hash_node_value<google::protobuf::Symbol,_true>).
    super__Hash_node_code_cache<true>._M_hash_code = __c;
    if (pp_Var9[uVar11] == (__node_base_ptr)0x0) {
      (p_Var8->super__Hash_node_base)._M_nxt =
           (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = &p_Var8->super__Hash_node_base;
      p_Var4 = (p_Var8->super__Hash_node_base)._M_nxt;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        pp_Var9[(ulong)p_Var4[2]._M_nxt % (this->symbols_by_parent_)._M_h._M_bucket_count] =
             &p_Var8->super__Hash_node_base;
        pp_Var9 = (this->symbols_by_parent_)._M_h._M_buckets;
      }
      pp_Var9[uVar11] = &(this->symbols_by_parent_)._M_h._M_before_begin;
    }
    else {
      (p_Var8->super__Hash_node_base)._M_nxt = pp_Var9[uVar11]->_M_nxt;
      pp_Var9[uVar11]->_M_nxt = &p_Var8->super__Hash_node_base;
    }
    psVar2 = &(this->symbols_by_parent_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_88 = (__node_ptr)0x0;
    std::
    _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)&local_90);
  }
  return p_Var7 == (__node_ptr)0x0;
LAB_0035724a:
  (_Var13._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var13._M_nxt;
  pp_Var9[uVar11] = p_Var1;
  if ((_Var13._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var10 = pp_Var9 + uVar12;
LAB_00357269:
    *pp_Var10 = _Var13._M_nxt;
  }
  goto LAB_00357219;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               const std::string& name,
                                               Symbol symbol) {
  GOOGLE_DCHECK_EQ(name, symbol.parent_name_key().second);
  GOOGLE_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}